

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifndef_guard.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::IfdefGuardPrinter::~IfdefGuardPrinter(IfdefGuardPrinter *this)

{
  Printer *this_00;
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string_view text;
  char *local_48;
  size_t local_40;
  char local_38;
  undefined7 uStack_37;
  size_type local_28;
  pointer local_20;
  
  this_00 = this->p_;
  local_20 = (this->ifdef_identifier_)._M_dataplus._M_p;
  local_28 = (this->ifdef_identifier_)._M_string_length;
  local_40 = 0;
  local_38 = '\0';
  local_48 = &local_38;
  absl::lts_20240722::substitute_internal::SubstituteAndAppendArray
            (&local_48,0xf,"\n#endif  // $0\n",&local_28,1);
  text._M_str = local_48;
  text._M_len = local_40;
  io::Printer::Print<>(this_00,text);
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  pcVar1 = (this->ifdef_identifier_)._M_dataplus._M_p;
  paVar2 = &(this->ifdef_identifier_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IfdefGuardPrinter::~IfdefGuardPrinter() {
  // We can't use variable substitution, because we don't know what delimiter
  // to use.
  p_->Print(absl::Substitute(
      R"(
#endif  // $0
)",
      ifdef_identifier_));
}